

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O2

void cfd::core::logger::log<long&,std::__cxx11::string&>
               (CfdSourceLocation *source,CfdLogLevel lvl,char *fmt,long *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  bool bVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  string_view format_str;
  format_args args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  string sStack_68;
  long local_48 [2];
  pointer local_38;
  size_type sStack_30;
  
  bVar1 = IsEnableLogLevel(lvl);
  if (bVar1) {
    local_48[0] = *args;
    local_38 = (args_1->_M_dataplus)._M_p;
    sStack_30 = args_1->_M_string_length;
    bVar2 = ::fmt::v7::to_string_view<char,_0>(fmt);
    format_str.data_ = (char *)bVar2.size_;
    format_str.size_ = 0xd3;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_48;
    ::fmt::v7::detail::vformat_abi_cxx11_(&sStack_68,(detail *)bVar2.data_,format_str,args_00);
    WriteLog(source,lvl,&sStack_68);
    ::std::__cxx11::string::~string((string *)&sStack_68);
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt, Args &&...args) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    auto message = fmt::format(fmt, args...);
    // std::string message = fmt::format(std::locale::messages, fmt, args...);
    cfd::core::logger::WriteLog(source, lvl, message);
  }
}